

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O1

Operation * __thiscall
MemoryManager::build_operation(MemoryManager *this,OpCode code,long left,long right)

{
  size_t *psVar1;
  Operation *pOVar2;
  _List_node_base *p_Var3;
  
  if (code < 4) {
    p_Var3 = (_List_node_base *)(&PTR_PTR_00109d90)[code];
    pOVar2 = (Operation *)operator_new(0x18);
    pOVar2->lf = left;
    pOVar2->rg = right;
    pOVar2->_vptr_Operation = (_func_int **)p_Var3;
    p_Var3 = (_List_node_base *)operator_new(0x18);
    p_Var3[1]._M_next = (_List_node_base *)pOVar2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->operations).
              super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return pOVar2;
  }
  __assert_fail("0 == \"Error: unexpected operation code.\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/rg3[P]cifras/memory_manager.cc"
                ,0x36,"Operation *MemoryManager::build_operation(OpCode, long, long)");
}

Assistant:

Operation *MemoryManager::build_operation(OpCode code, long left, long right)
{
	Operation *op = 0;
	switch (code) {
	case Op_Sum:
		op = new Sum(left, right);
		break;
	case Op_Mul:
		op = new Mul(left, right);
		break;
	case Op_Sub:
		op = new Sub(left, right);
		break;
	case Op_Div:
		op = new Div(left, right);
		break;
	default:
		assert(0 == "Error: unexpected operation code.");
		break;
	}
	operations.push_back(op);
	return op;
}